

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O1

real __thiscall fasttext::QuantMatrix::dotRow(QuantMatrix *this,Vector *vec,int64_t i)

{
  real *prVar1;
  real rVar2;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/quantmatrix.cc"
                  ,0x35,"virtual real fasttext::QuantMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if (i < (this->super_Matrix).m_) {
    if ((long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 == (this->super_Matrix).n_) {
      if (this->qnorm_ == true) {
        prVar1 = ProductQuantizer::get_centroids
                           ((this->npq_)._M_t.
                            super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                            .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl
                            ,0,(this->norm_codes_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[i]);
        rVar2 = *prVar1;
      }
      else {
        rVar2 = 1.0;
      }
      rVar2 = ProductQuantizer::mulcode
                        ((this->pq_)._M_t.
                         super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                         .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
                         vec,(this->codes_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(int32_t)i,rVar2);
      return rVar2;
    }
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/quantmatrix.cc"
                  ,0x37,"virtual real fasttext::QuantMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/quantmatrix.cc"
                ,0x36,"virtual real fasttext::QuantMatrix::dotRow(const Vector &, int64_t) const");
}

Assistant:

real QuantMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real norm = 1;
  if (qnorm_) {
    norm = npq_->get_centroids(0, norm_codes_[i])[0];
  }
  return pq_->mulcode(vec, codes_.data(), i, norm);
}